

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

fileMetrics *
exrmetrics(char *inFileName,char *outFileName,int part,Compression compression,float level,
          int passes,bool write,bool reread,PixelMode pixelMode,bool verbose)

{
  float fVar1;
  Compression CVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  char *pcVar9;
  Header *pHVar10;
  reference pvVar11;
  Compression *pCVar12;
  int *piVar13;
  float *pfVar14;
  Channel *pCVar15;
  size_type sVar16;
  fileMetrics *pfVar17;
  MultiPartInputFile *pMVar18;
  vector<double,_std::allocator<double>_> *pvVar19;
  reference pvVar20;
  int in_ECX;
  fileMetrics *in_RDX;
  char *in_RSI;
  fileMetrics *in_RDI;
  Compression in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  byte in_stack_00000008;
  byte in_stack_00000010;
  int in_stack_00000018;
  byte in_stack_00000020;
  size_t i_2;
  stat outstats;
  stat instats;
  MultiPartInputFile *in_1;
  MemIStream istream;
  MultiPartOutputFile *out_1;
  MemOStream ostream;
  int i_1;
  string name_1;
  MultiPartOutputFile out;
  DummyOStream tmp;
  uint64_t fileSize;
  vector<partData,_std::allocator<partData>_> parts;
  char *dot;
  char *name;
  Iterator i;
  int p_1;
  bool compressionSet;
  int p;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> outHeaders;
  MultiPartInputFile in;
  fileMetrics *metrics;
  partStats *in_stack_fffffffffffff9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  fileMetrics *in_stack_fffffffffffff9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  fileMetrics *in_stack_fffffffffffff9d0;
  size_type in_stack_fffffffffffff9d8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffff9e0;
  vector<double,_std::allocator<double>_> *output;
  MultiPartInputFile *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  PixelMode in_stack_fffffffffffffa0c;
  fileMetrics *in_stack_fffffffffffffa40;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffa48;
  Header *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa5c;
  fileMetrics *in_stack_fffffffffffffa60;
  ostream *in_stack_fffffffffffffa68;
  ostream *in_stack_fffffffffffffa70;
  vector<double,_std::allocator<double>_> *local_410;
  stat local_408;
  stat local_378;
  MultiPartInputFile *local_2e8;
  IStream local_2e0 [56];
  fileMetrics *local_2a8;
  OStream local_2a0 [79];
  fileMetrics *in_stack_fffffffffffffdb0;
  vector<partData,_std::allocator<partData>_> *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffdc8;
  MultiPartInputFile *in_stack_fffffffffffffdd0;
  DummyOStream local_220;
  uint64_t local_1f0;
  vector<partData,_std::allocator<partData>_> local_1e0;
  char *local_1c8;
  char *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a0;
  int local_198;
  byte local_191;
  int local_190;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_188;
  byte local_16a;
  undefined1 local_169;
  MultiPartInputFile local_80 [48];
  string local_50 [37];
  byte local_2b;
  byte local_2a;
  byte local_29;
  int local_28;
  float local_24;
  Compression local_20;
  int local_1c;
  fileMetrics *local_18;
  char *local_10;
  
  local_29 = in_stack_00000008 & 1;
  local_2a = in_stack_00000010 & 1;
  local_2b = in_stack_00000020 & 1;
  local_28 = in_R9D;
  local_24 = in_XMM0_Da;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_2b != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"read ");
    std::operator<<(poVar7,local_10);
    poVar7 = std::operator<<((ostream *)&std::cerr," as ");
    modeName_abi_cxx11_(in_stack_fffffffffffffa0c);
    poVar7 = std::operator<<(poVar7,local_50);
    std::operator<<(poVar7,"... ");
    std::__cxx11::string::~string(local_50);
    std::ostream::flush();
  }
  pcVar9 = local_10;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_80,pcVar9,iVar4,true);
  iVar4 = local_1c;
  if ((local_1c != -1) && (iVar5 = Imf_3_4::MultiPartInputFile::parts(), iVar5 <= iVar4)) {
    local_169 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
    Imf_3_4::MultiPartInputFile::parts();
    std::__cxx11::to_string(in_stack_fffffffffffffa0c);
    std::operator+(in_stack_fffffffffffff9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
    std::__cxx11::to_string(in_stack_fffffffffffffa0c);
    std::operator+(in_stack_fffffffffffff9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    pcVar9 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(prVar8,pcVar9);
    local_169 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_16a = 0;
  fileMetrics::fileMetrics(in_stack_fffffffffffff9d0);
  if (local_1c == -1) {
    Imf_3_4::MultiPartInputFile::parts();
  }
  std::allocator<Imf_3_4::Header>::allocator((allocator<Imf_3_4::Header> *)0x1176d4);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
             (allocator_type *)in_stack_fffffffffffff9d0);
  std::allocator<Imf_3_4::Header>::~allocator((allocator<Imf_3_4::Header> *)0x117700);
  if (local_1c == -1) {
    for (local_190 = 0; iVar4 = local_190, iVar5 = Imf_3_4::MultiPartInputFile::parts(),
        iVar4 < iVar5; local_190 = local_190 + 1) {
      pHVar10 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_80);
      pvVar11 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                          (&local_188,(long)local_190);
      Imf_3_4::Header::operator=(pvVar11,pHVar10);
    }
  }
  else {
    pHVar10 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_80);
    pvVar11 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                        (&local_188,0);
    Imf_3_4::Header::operator=(pvVar11,pHVar10);
  }
  local_191 = 0;
  for (local_198 = 0; iVar4 = local_198, iVar5 = Imf_3_4::MultiPartInputFile::parts(),
      CVar2 = local_20, iVar4 < iVar5; local_198 = local_198 + 1) {
    if ((int)local_20 < 10) {
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                (&local_188,(long)local_198);
      pCVar12 = (Compression *)Imf_3_4::Header::compression();
      *pCVar12 = CVar2;
    }
    uVar6 = std::isinf((double)(ulong)(uint)local_24);
    if (((uVar6 & 1) == 0) && (-1.0 <= local_24)) {
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                (&local_188,(long)local_198);
      piVar13 = (int *)Imf_3_4::Header::compression();
      fVar1 = local_24;
      iVar4 = *piVar13;
      if (iVar4 - 2U < 2) {
        iVar4 = (int)local_24;
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                  (&local_188,(long)local_198);
        piVar13 = (int *)Imf_3_4::Header::zipCompressionLevel();
        *piVar13 = iVar4;
        local_191 = 1;
      }
      else if (iVar4 == 8 || iVar4 == 9) {
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                  (&local_188,(long)local_198);
        pfVar14 = (float *)Imf_3_4::Header::dwaCompressionLevel();
        *pfVar14 = fVar1;
        local_191 = 1;
      }
    }
    if (in_stack_00000018 != 0) {
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                (&local_188,(long)local_198);
      Imf_3_4::Header::channels();
      local_1a0 = Imf_3_4::ChannelList::begin();
      while( true ) {
        Imf_3_4::ChannelList::ConstIterator::ConstIterator
                  ((ConstIterator *)in_stack_fffffffffffff9c0,(Iterator *)in_stack_fffffffffffff9b8)
        ;
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                  (&local_188,(long)local_198);
        Imf_3_4::Header::channels();
        local_1b8 = Imf_3_4::ChannelList::end();
        Imf_3_4::ChannelList::ConstIterator::ConstIterator
                  ((ConstIterator *)in_stack_fffffffffffff9c0,(Iterator *)in_stack_fffffffffffff9b8)
        ;
        bVar3 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffff9c0,
                                    (ConstIterator *)in_stack_fffffffffffff9b8);
        if (!bVar3) break;
        local_1c0 = Imf_3_4::ChannelList::Iterator::name((Iterator *)0x117b44);
        local_1c8 = strrchr(local_1c0,0x72);
        if (local_1c8 != (char *)0x0) {
          local_1c0 = local_1c8 + 1;
        }
        if ((in_stack_00000018 == 1) ||
           ((in_stack_00000018 == 3 &&
            ((((iVar4 = strcmp(local_1c0,"R"), iVar4 == 0 ||
               (iVar4 = strcmp(local_1c0,"G"), iVar4 == 0)) ||
              (iVar4 = strcmp(local_1c0,"B"), iVar4 == 0)) ||
             (iVar4 = strcmp(local_1c0,"A"), iVar4 == 0)))))) {
          pCVar15 = Imf_3_4::ChannelList::Iterator::channel((Iterator *)0x117c20);
          *(undefined4 *)pCVar15 = 1;
        }
        else if ((in_stack_00000018 == 2) || (in_stack_00000018 == 3)) {
          pCVar15 = Imf_3_4::ChannelList::Iterator::channel((Iterator *)0x117c5b);
          *(undefined4 *)pCVar15 = 2;
        }
        Imf_3_4::ChannelList::Iterator::operator++((Iterator *)in_stack_fffffffffffff9c0);
      }
    }
  }
  uVar6 = std::isinf((double)(ulong)(uint)local_24);
  if ((((uVar6 & 1) == 0) && (-1.0 <= local_24)) && ((local_191 & 1) == 0)) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar8,"-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_1c == -1) {
    Imf_3_4::MultiPartInputFile::parts();
  }
  std::allocator<partData>::allocator((allocator<partData> *)0x117dbd);
  std::vector<partData,_std::allocator<partData>_>::vector
            ((vector<partData,_std::allocator<partData>_> *)in_stack_fffffffffffff9e0,
             in_stack_fffffffffffff9d8,(allocator_type *)in_stack_fffffffffffff9d0);
  std::allocator<partData>::~allocator((allocator<partData> *)0x117de9);
  std::vector<partData,_std::allocator<partData>_>::size(&local_1e0);
  std::vector<partStats,_std::allocator<partStats>_>::resize
            ((vector<partStats,_std::allocator<partStats>_> *)in_stack_fffffffffffff9e0,
             in_stack_fffffffffffff9d8);
  iVar4 = stack0xfffffffffffffdac;
  uVar6 = (uint)stack0xfffffffffffffdac >> 0x18;
  initAndReadFile(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                  in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,SUB41(uVar6,0));
  stack0xfffffffffffffdac = iVar4;
  if ((local_29 & 1) != 0) {
    local_1f0 = 0;
    if (local_18 == (fileMetrics *)0x0) {
      DummyOStream::DummyOStream((DummyOStream *)in_stack_fffffffffffff9c0);
      pHVar10 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::data
                          ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x117e90);
      sVar16 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_188);
      iVar4 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)&stack0xfffffffffffffdd0,&local_220.super_OStream,pHVar10,
                 (int)sVar16,false,iVar4);
      writeFile((MultiPartOutputFile *)in_stack_fffffffffffffa70,
                (vector<partData,_std::allocator<partData>_> *)in_stack_fffffffffffffa68,
                in_stack_fffffffffffffa60,SUB41((uint)in_stack_fffffffffffffa5c >> 0x18,0));
      local_1f0 = DummyOStream::tellp(&local_220);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile
                ((MultiPartOutputFile *)&stack0xfffffffffffffdd0);
      DummyOStream::~DummyOStream((DummyOStream *)0x117f4d);
    }
    if ((local_2b & 1) != 0) {
      std::operator<<((ostream *)&std::cerr," write ");
      if (local_20 != NUM_COMPRESSION_METHODS) {
        std::__cxx11::string::string((string *)&stack0xfffffffffffffdb0);
        Imf_3_4::getCompressionNameFromId(local_20,(string *)&stack0xfffffffffffffdb0);
        in_stack_fffffffffffffa70 = std::operator<<((ostream *)&std::cerr,"compression ");
        std::operator<<(in_stack_fffffffffffffa70,(string *)&stack0xfffffffffffffdb0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
      }
      std::operator<<((ostream *)&std::cerr,"... ");
      std::ostream::flush();
    }
    for (stack0xfffffffffffffdac = 0; stack0xfffffffffffffdac < local_28;
        register0x00000000 = stack0xfffffffffffffdac + 1) {
      if (((local_2b & 1) != 0) && (1 < local_28)) {
        in_stack_fffffffffffffa68 =
             (ostream *)std::ostream::operator<<(&std::cerr,stack0xfffffffffffffdac);
        std::operator<<(in_stack_fffffffffffffa68,' ');
        std::ostream::flush();
      }
      MemOStream::MemOStream
                ((MemOStream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 (uint64_t)in_stack_fffffffffffff9e8);
      if (local_18 == (fileMetrics *)0x0) {
        pfVar17 = (fileMetrics *)operator_new(0x10);
        pHVar10 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::data
                            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x118271);
        sVar16 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(&local_188);
        iVar4 = Imf_3_4::globalThreadCount();
        Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                  ((MultiPartOutputFile *)pfVar17,local_2a0,pHVar10,(int)sVar16,false,iVar4);
        local_2a8 = pfVar17;
      }
      else {
        in_stack_fffffffffffffa60 = (fileMetrics *)operator_new(0x10);
        in_stack_fffffffffffffa48 = &local_188;
        in_stack_fffffffffffffa40 = local_18;
        in_stack_fffffffffffffa50 =
             std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::data
                       ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x118197);
        sVar16 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                           (in_stack_fffffffffffffa48);
        in_stack_fffffffffffffa5c = Imf_3_4::globalThreadCount();
        Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                  ((MultiPartOutputFile *)in_stack_fffffffffffffa60,
                   (char *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa50,(int)sVar16,false,
                   in_stack_fffffffffffffa5c);
        local_2a8 = in_stack_fffffffffffffa60;
      }
      writeFile((MultiPartOutputFile *)in_stack_fffffffffffffa70,
                (vector<partData,_std::allocator<partData>_> *)in_stack_fffffffffffffa68,
                in_stack_fffffffffffffa60,SUB41((uint)in_stack_fffffffffffffa5c >> 0x18,0));
      if (local_2a8 != (fileMetrics *)0x0) {
        (*(code *)*(pointer *)
                   ((long)&(((local_2a8->stats).
                             super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                             super__Vector_impl_data._M_start)->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + 8))();
      }
      if ((local_2a & 1) != 0) {
        MemIStream::MemIStream
                  ((MemIStream *)in_stack_fffffffffffff9c0,(MemOStream *)in_stack_fffffffffffff9b8);
        if (local_18 == (fileMetrics *)0x0) {
          pMVar18 = (MultiPartInputFile *)operator_new(0x20);
          in_stack_fffffffffffff9f4 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartInputFile::MultiPartInputFile
                    (pMVar18,local_2e0,in_stack_fffffffffffff9f4,true);
          local_2e8 = pMVar18;
        }
        else {
          pMVar18 = (MultiPartInputFile *)operator_new(0x20);
          pfVar17 = local_18;
          iVar4 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartInputFile::MultiPartInputFile(pMVar18,(char *)pfVar17,iVar4,true);
          local_2e8 = pMVar18;
        }
        rereadFile((MultiPartInputFile *)in_stack_fffffffffffffa50,
                   (vector<partData,_std::allocator<partData>_> *)in_stack_fffffffffffffa48,
                   in_stack_fffffffffffffa40);
        in_stack_fffffffffffff9e8 = local_2e8;
        if (local_2e8 != (MultiPartInputFile *)0x0) {
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile
                    ((MultiPartInputFile *)in_stack_fffffffffffff9c0);
          operator_delete(in_stack_fffffffffffff9e8,0x20);
        }
        MemIStream::~MemIStream((MemIStream *)0x1184c5);
      }
      MemOStream::~MemOStream((MemOStream *)in_stack_fffffffffffff9c0);
    }
    stat(local_10,&local_378);
    in_RDI->inputFileSize = local_378.st_size;
    if (local_18 == (fileMetrics *)0x0) {
      in_RDI->outputFileSize = local_1f0;
    }
    else {
      stat((char *)local_18,&local_408);
      in_RDI->outputFileSize = local_408.st_size;
    }
  }
  std::vector<partStats,_std::allocator<partStats>_>::operator[](&in_RDI->stats,0);
  partStats::operator=((partStats *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  local_410 = (vector<double,_std::allocator<double>_> *)0x1;
  while (output = local_410,
        pvVar19 = (vector<double,_std::allocator<double>_> *)
                  std::vector<partStats,_std::allocator<partStats>_>::size(&in_RDI->stats),
        output < pvVar19) {
    pvVar19 = &(in_RDI->totalStats).readPerf;
    std::vector<partStats,_std::allocator<partStats>_>::operator[]
              (&in_RDI->stats,(size_type)local_410);
    accumulate(output,pvVar19);
    in_stack_fffffffffffff9d0 = (fileMetrics *)&in_RDI->totalStats;
    std::vector<partStats,_std::allocator<partStats>_>::operator[]
              (&in_RDI->stats,(size_type)local_410);
    accumulate(output,pvVar19);
    std::vector<partStats,_std::allocator<partStats>_>::operator[]
              (&in_RDI->stats,(size_type)local_410);
    accumulate(output,pvVar19);
    in_stack_fffffffffffff9c0 = (fileMetrics *)&(in_RDI->totalStats).rereadPerf;
    std::vector<partStats,_std::allocator<partStats>_>::operator[]
              (&in_RDI->stats,(size_type)local_410);
    accumulate(output,pvVar19);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &(in_RDI->totalStats).countRereadPerf;
    std::vector<partStats,_std::allocator<partStats>_>::operator[]
              (&in_RDI->stats,(size_type)local_410);
    accumulate(output,pvVar19);
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    (in_RDI->totalStats).sizeData.pixelCount =
         (pvVar20->sizeData).pixelCount + (in_RDI->totalStats).sizeData.pixelCount;
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    (in_RDI->totalStats).sizeData.channelCount =
         (pvVar20->sizeData).channelCount + (in_RDI->totalStats).sizeData.channelCount;
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    (in_RDI->totalStats).sizeData.rawSize =
         (pvVar20->sizeData).rawSize + (in_RDI->totalStats).sizeData.rawSize;
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    (in_RDI->totalStats).sizeData.tileCount =
         (pvVar20->sizeData).tileCount + (in_RDI->totalStats).sizeData.tileCount;
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    (in_RDI->totalStats).sizeData.isDeep =
         ((in_RDI->totalStats).sizeData.isDeep & 1U) != 0 || ((pvVar20->sizeData).isDeep & 1U) != 0;
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    (in_RDI->totalStats).sizeData.isTiled =
         ((in_RDI->totalStats).sizeData.isTiled & 1U) != 0 ||
         ((pvVar20->sizeData).isTiled & 1U) != 0;
    pvVar20 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (&in_RDI->stats,(size_type)local_410);
    if ((pvVar20->sizeData).compression != (in_RDI->totalStats).sizeData.compression) {
      (in_RDI->totalStats).sizeData.compression = NUM_COMPRESSION_METHODS;
    }
    std::vector<partStats,_std::allocator<partStats>_>::operator[]
              (&in_RDI->stats,(size_type)local_410);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9c0,__rhs);
    if (bVar3) {
      std::__cxx11::string::operator=((string *)&(in_RDI->totalStats).sizeData.partType,"");
    }
    local_410 = (vector<double,_std::allocator<double>_> *)
                ((long)&(local_410->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
  }
  if ((local_2b & 1) != 0) {
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  local_16a = 1;
  std::vector<partData,_std::allocator<partData>_>::~vector
            ((vector<partData,_std::allocator<partData>_> *)in_stack_fffffffffffff9d0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_stack_fffffffffffff9d0)
  ;
  if ((local_16a & 1) == 0) {
    fileMetrics::~fileMetrics(in_stack_fffffffffffff9c0);
  }
  Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)in_stack_fffffffffffff9c0);
  return in_RDI;
}

Assistant:

fileMetrics
exrmetrics (
    const char*                        inFileName,
    const char*                        outFileName,
    int                                part,
    OPENEXR_IMF_NAMESPACE::Compression compression,
    float                              level,
    int                                passes,
    bool                               write,
    bool                               reread,
    PixelMode                          pixelMode,
    bool                               verbose)
{

    if (verbose)
    {
        cerr << "read " << inFileName;
        cerr << " as " << modeName (pixelMode) << "... ";
        cerr.flush ();
    }

    MultiPartInputFile in (inFileName);
    if (part != -1 && part >= in.parts ())
    {
        throw runtime_error ((string (inFileName) + " only contains " +
                              to_string (in.parts ()) +
                              " parts. Cannot copy part " + to_string (part))
                                 .c_str ());
    }
    fileMetrics metrics;

    //write all parts if part==-1, otherwise write single part specified
    vector<Header> outHeaders (part == -1 ? in.parts () : 1);
    if (part == -1)
    {
        for (int p = 0; p < in.parts (); ++p)
        {
            outHeaders[p] = in.header (p);
        }
    }
    else { outHeaders[0] = in.header (part); }

    bool compressionSet = false;

    for (int p = 0; p < in.parts (); ++p)
    {
        if (compression < NUM_COMPRESSION_METHODS)
        {
            outHeaders[p].compression () = compression;
        }

        if (!isinf (level) && level >= -1)
        {
            switch (outHeaders[p].compression ())
            {
                case DWAA_COMPRESSION:
                case DWAB_COMPRESSION:
                    outHeaders[p].dwaCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                case ZIP_COMPRESSION:
                case ZIPS_COMPRESSION:
                    outHeaders[p].zipCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                    //            case ZSTD_COMPRESSION :
                    //                outHeader.zstdCompressionLevel()=level;
                    //                break;
                default: break;
            }
        }

        if (pixelMode != PIXELMODE_ORIGINAL)
        {
            for (ChannelList::Iterator i = outHeaders[p].channels ().begin ();
                 i != outHeaders[p].channels ().end ();
                 ++i)
            {
                // find channel suffix within full channel name (so 'R' in 'layer.R')
                const char* name = i.name ();
                const char* dot  = strrchr (name, 'r');
                if (dot) { name = dot + 1; }

                if (pixelMode == PIXELMODE_ALL_HALF ||
                    (pixelMode == PIXELMODE_MIXED_HALF_FLOAT &&
                     (!strcmp (name, "R") || !strcmp (name, "G") ||
                      !strcmp (name, "B") || !strcmp (name, "A"))))
                {
                    i.channel ().type = HALF;
                }
                else if (
                    pixelMode == PIXELMODE_ALL_FLOAT ||
                    pixelMode == PIXELMODE_MIXED_HALF_FLOAT)
                {
                    i.channel ().type = FLOAT;
                }
            }
        }
    }

    // abort if level was set but no parts had a compression type with a level
    if (!isinf (level) && level >= -1 && !compressionSet)
    {
        throw runtime_error (
            "-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
    }

    vector<partData> parts (part == -1 ? in.parts () : 1);
    metrics.stats.resize (parts.size ());

    initAndReadFile (in, outHeaders, part, parts, metrics, reread);

    if (write)
    {

        //
        // when NOT writing to file, write to preallocated block of data
        // precompute the total datasize, so no memory reallocation is required
        //
        uint64_t fileSize = 0;
        if (!outFileName)
        {

            DummyOStream        tmp;
            MultiPartOutputFile out (
                tmp, outHeaders.data (), outHeaders.size ());
            writeFile (out, parts, metrics, false);
            fileSize = tmp.tellp ();
        }

        //
        // write to output; re-read output back to input
        //

        if (verbose)
        {
            cerr << " write ";
            if (compression != NUM_COMPRESSION_METHODS)
            {
                string name;
                getCompressionNameFromId (compression, name);
                cerr << "compression " << name;
            }
            cerr << "... ";
            cerr.flush ();
        }

        for (int i = 0; i < passes; ++i)
        {
            if (verbose && passes > 1)
            {
                cerr << i << ' ';
                cerr.flush ();
            }
            MemOStream           ostream (fileSize);
            MultiPartOutputFile* out;
            if (outFileName)
            {
                out = new MultiPartOutputFile (
                    outFileName, outHeaders.data (), outHeaders.size ());
            }
            else
            {
                out = new MultiPartOutputFile (
                    ostream, outHeaders.data (), outHeaders.size ());
            }
            writeFile (*out, parts, metrics, true);
            delete out;

            if (reread)
            {
                MemIStream          istream (ostream);
                MultiPartInputFile* in;
                if (outFileName) { in = new MultiPartInputFile (outFileName); }
                else { in = new MultiPartInputFile (istream); }

                rereadFile (*in, parts, metrics);

                delete in;
            }
        }

        struct stat instats, outstats;
        stat (inFileName, &instats);
        metrics.inputFileSize = instats.st_size;
        if (outFileName)
        {
            stat (outFileName, &outstats);
            metrics.outputFileSize = outstats.st_size;
        }
        else { metrics.outputFileSize = fileSize; }
    }

    //
    // sum across all parts
    //

    metrics.totalStats = metrics.stats[0];
    for (size_t i = 1; i < metrics.stats.size (); ++i)
    {
        accumulate (metrics.totalStats.readPerf, metrics.stats[i].readPerf);
        accumulate (
            metrics.totalStats.countReadPerf, metrics.stats[i].countReadPerf);
        accumulate (metrics.totalStats.writePerf, metrics.stats[i].writePerf);
        accumulate (metrics.totalStats.rereadPerf, metrics.stats[i].rereadPerf);
        accumulate (
            metrics.totalStats.countRereadPerf,
            metrics.stats[i].countRereadPerf);

        metrics.totalStats.sizeData.pixelCount +=
            metrics.stats[i].sizeData.pixelCount;
        metrics.totalStats.sizeData.channelCount +=
            metrics.stats[i].sizeData.channelCount;
        metrics.totalStats.sizeData.rawSize +=
            metrics.stats[i].sizeData.rawSize;
        metrics.totalStats.sizeData.tileCount +=
            metrics.stats[i].sizeData.tileCount;

        metrics.totalStats.sizeData.isDeep |= metrics.stats[i].sizeData.isDeep;
        metrics.totalStats.sizeData.isTiled |=
            metrics.stats[i].sizeData.isTiled;

        //check for mixed compression or part types within file

        if (metrics.stats[i].sizeData.compression !=
            metrics.totalStats.sizeData.compression)
        {
            metrics.totalStats.sizeData.compression = NUM_COMPRESSION_METHODS;
        }
        if (metrics.stats[i].sizeData.partType !=
            metrics.totalStats.sizeData.partType)
        {
            metrics.totalStats.sizeData.partType = "";
        }
    }

    if (verbose) { cerr << endl; }
    return metrics;
}